

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O2

void __thiscall
Lib::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node*,Kernel::TypedTermList,bool,bool,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
          (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
           *this,SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *a,Node *as,
          TypedTermList as_1,bool as_2,bool as_3,AbstractingUnifier *as_4,AbstractionOracle as_5,
          bool as_6)

{
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  Node *local_68;
  SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *local_60;
  uint64_t local_58;
  uint64_t local_50;
  SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> **local_48;
  Node **local_40;
  uint64_t *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  AbstractingUnifier *local_20;
  AbstractionOracle *local_18;
  undefined1 *local_10;
  
  local_50 = (uint64_t)as_1._sort._content;
  local_58 = (uint64_t)as_1.super_TermList._content;
  local_38 = &local_58;
  local_48 = &local_60;
  local_40 = &local_68;
  local_30 = &local_69;
  local_28 = &local_6a;
  local_6a = as_3;
  local_10 = &local_6b;
  local_6b = as_6;
  local_20 = as_4;
  local_18 = &as_5;
  local_69 = as_2;
  local_68 = as;
  local_60 = a;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_*,_Kernel::TypedTermList,_bool,_bool,_Kernel::AbstractingUnifier,_Kernel::AbstractionOracle,_bool>
  ::anon_class_64_8_e3e07548::operator()((anon_class_64_8_e3e07548 *)this);
  return;
}

Assistant:

Recycled(A a, As... as) 
    : _self([&](){ 
        if (mem().isNonEmpty()) {
          auto elem = mem().pop();
          elem->init(std::move(a), std::move(as)...);
          return elem;
        } else {
          return IF_USE_PTRS(std::make_unique<T>, T)(std::move(a), std::move(as)...);
        }
    }())
  { }